

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O3

void __thiscall QSystemTrayIconPrivate::updateMenu_sys(QSystemTrayIconPrivate *this)

{
  Data *pDVar1;
  QPlatformSystemTrayIcon *pQVar2;
  QPlatformMenu *pQVar3;
  QObject *menu;
  
  if (((this->qpa_sys != (QPlatformSystemTrayIcon *)0x0) &&
      (pDVar1 = (this->menu).wp.d, pDVar1 != (Data *)0x0)) &&
     (menu = (this->menu).wp.value, menu != (QObject *)0x0 && *(int *)(pDVar1 + 4) != 0)) {
    if (*(int *)(pDVar1 + 4) == 0) {
      menu = (QObject *)0x0;
    }
    addPlatformMenu(this,(QMenu *)menu);
    pQVar2 = this->qpa_sys;
    pQVar3 = QMenu::platformMenu((QMenu *)(this->menu).wp.value);
    (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,pQVar3);
    return;
  }
  return;
}

Assistant:

void QSystemTrayIconPrivate::updateMenu_sys()
{
#if QT_CONFIG(menu)
    if (qpa_sys && menu) {
        addPlatformMenu(menu);
        qpa_sys->updateMenu(menu->platformMenu());
    }
#endif
}